

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateExport.cpp
# Opt level: O0

void helicsPublicationPublishDouble(HelicsPublication pub,double val,HelicsError *err)

{
  PublicationObject *pPVar1;
  PublicationObject *pubObj;
  double in_stack_00000078;
  Publication *in_stack_00000080;
  HelicsError *in_stack_ffffffffffffffd0;
  HelicsPublication in_stack_ffffffffffffffd8;
  
  pPVar1 = anon_unknown.dwarf_5d1c2::verifyPublication
                     (in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  if (pPVar1 != (PublicationObject *)0x0) {
    helics::Publication::publish(in_stack_00000080,in_stack_00000078);
  }
  return;
}

Assistant:

void helicsPublicationPublishDouble(HelicsPublication pub, double val, HelicsError* err)
{
    auto* pubObj = verifyPublication(pub, err);
    if (pubObj == nullptr) {
        return;
    }
    try {
        pubObj->pubPtr->publish(val);
    }
    catch (...) {
        helicsErrorHandler(err);
    }
}